

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcFx.c
# Opt level: O2

void Fx_ManCreateDivisors(Fx_Man_t *p)

{
  size_t __size;
  uint in_EAX;
  int iVar1;
  int iVar2;
  Hsh_VecMan_t *pHVar3;
  Vec_Int_t *pVVar4;
  Vec_Flt_t *pVVar5;
  float *pfVar6;
  Vec_Que_t *pVVar7;
  ulong uVar8;
  int *piVar9;
  Vec_Wec_t *p_00;
  uint uVar10;
  float fVar11;
  ulong uStack_38;
  int fWarning;
  
  uStack_38 = (ulong)in_EAX;
  if (p->pHash != (Hsh_VecMan_t *)0x0) {
    __assert_fail("p->pHash == NULL",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/base/abci/abcFx.c"
                  ,0x36d,"void Fx_ManCreateDivisors(Fx_Man_t *)");
  }
  pHVar3 = (Hsh_VecMan_t *)calloc(1,0x28);
  iVar1 = Abc_PrimeCudd(1000);
  pVVar4 = Vec_IntStartFull(iVar1);
  pHVar3->vTable = pVVar4;
  pVVar4 = Vec_IntAlloc(4000);
  pHVar3->vData = pVVar4;
  pVVar4 = Vec_IntAlloc(1000);
  pHVar3->vMap = pVVar4;
  p->pHash = pHVar3;
  pVVar5 = (Vec_Flt_t *)malloc(0x10);
  pVVar5->nCap = 1000;
  pVVar5->nSize = 0;
  pfVar6 = (float *)malloc(4000);
  pVVar5->pArray = pfVar6;
  p->vWeights = pVVar5;
  iVar1 = 0;
  while( true ) {
    p_00 = p->vCubes;
    iVar2 = p_00->nSize;
    if (iVar2 <= iVar1) break;
    pVVar4 = Vec_WecEntry(p_00,iVar1);
    Fx_ManCubeSingleCubeDivisors(p,pVVar4,0,0);
    iVar1 = iVar1 + 1;
  }
  if (p->nDivsS == p->vWeights->nSize) {
    iVar1 = 0;
    while (iVar1 < iVar2) {
      pVVar4 = Vec_WecEntry(p_00,iVar1);
      iVar1 = iVar1 + 1;
      Fx_ManCubeDoubleCubeDivisors(p,iVar1,pVVar4,0,0,&fWarning);
      p_00 = p->vCubes;
      iVar2 = p_00->nSize;
    }
    pVVar5 = p->vWeights;
    uVar10 = pVVar5->nSize;
    pVVar7 = (Vec_Que_t *)calloc(1,0x20);
    uVar8 = 0x10;
    if (0x10 < (int)uVar10) {
      uVar8 = (ulong)uVar10;
    }
    pVVar7->nSize = 1;
    pVVar7->nCap = (int)uVar8 + 1;
    __size = uVar8 * 4 + 4;
    piVar9 = (int *)malloc(__size);
    memset(piVar9,0xff,__size);
    pVVar7->pHeap = piVar9;
    piVar9 = (int *)malloc(__size);
    memset(piVar9,0xff,__size);
    pVVar7->pOrder = piVar9;
    p->vPrio = pVVar7;
    pVVar7->pCostsFlt = &pVVar5->pArray;
    for (iVar1 = 0; iVar1 < (int)uVar10; iVar1 = iVar1 + 1) {
      fVar11 = Vec_FltEntry(pVVar5,iVar1);
      if (0.0 < fVar11) {
        Vec_QuePush(p->vPrio,iVar1);
      }
      pVVar5 = p->vWeights;
      uVar10 = pVVar5->nSize;
    }
    return;
  }
  __assert_fail("p->nDivsS == Vec_FltSize(p->vWeights)",
                "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/base/abci/abcFx.c"
                ,0x373,"void Fx_ManCreateDivisors(Fx_Man_t *)");
}

Assistant:

void Fx_ManCreateDivisors( Fx_Man_t * p )
{
    Vec_Int_t * vCube;
    float Weight;
    int i, fWarning = 0;
    // alloc hash table
    assert( p->pHash == NULL );
    p->pHash = Hsh_VecManStart( 1000 );
    p->vWeights = Vec_FltAlloc( 1000 );
    // create single-cube two-literal divisors
    Vec_WecForEachLevel( p->vCubes, vCube, i )
        Fx_ManCubeSingleCubeDivisors( p, vCube, 0, 0 ); // add - no update
    assert( p->nDivsS == Vec_FltSize(p->vWeights) );
    // create two-cube divisors
    Vec_WecForEachLevel( p->vCubes, vCube, i )
        Fx_ManCubeDoubleCubeDivisors( p, i+1, vCube, 0, 0, &fWarning ); // add - no update
    // create queue with all divisors
    p->vPrio = Vec_QueAlloc( Vec_FltSize(p->vWeights) );
    Vec_QueSetPriority( p->vPrio, Vec_FltArrayP(p->vWeights) );
    Vec_FltForEachEntry( p->vWeights, Weight, i )
        if ( Weight > 0.0 )
            Vec_QuePush( p->vPrio, i );
}